

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::listen_succeeded_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_succeeded_alert *this)

{
  undefined8 uVar1;
  char ret [200];
  string local_108;
  char local_e8 [200];
  
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::sock_type_str(libtorrent::socket_type_t)::type_str +
           (ulong)this->socket_type * 8);
  print_endpoint_abi_cxx11_
            (&local_108,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,0x432e80);
  snprintf(local_e8,200,"successfully listening on [%s] %s",uVar1,local_108._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_succeeded_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "successfully listening on [%s] %s"
			, sock_type_str(socket_type), print_endpoint(address, port).c_str());
		return ret;
	}